

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::SstReader::BP5PerformGets(SstReader *this)

{
  iterator iVar1;
  SstStatusValue SVar2;
  void *DP_TimestepInfo;
  ReadRequest *Req;
  pointer pRVar3;
  void **ppvVar4;
  vector<void_*,_std::allocator<void_*>_> sstReadHandlers;
  void *ret;
  vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
  ReadRequests;
  size_t maxReadSize;
  void **local_e8;
  iterator iStack_e0;
  void **local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
  local_50;
  size_t local_38;
  
  adios2::format::BP5Deserializer::GenerateReadRequests
            (&local_50,this->m_BP5Deserializer,true,&local_38);
  local_e8 = (void **)0x0;
  iStack_e0._M_current = (void **)0x0;
  local_d8 = (void **)0x0;
  if (local_50.
      super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.
      super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar3 = local_50.
             super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ppvVar4 = this->m_CurrentStepMetaData->DP_TimestepInfo;
      if (ppvVar4 == (void **)0x0) {
        DP_TimestepInfo = (void *)0x0;
      }
      else {
        DP_TimestepInfo = ppvVar4[pRVar3->WriterRank];
      }
      local_d0._M_dataplus._M_p =
           (pointer)SstReadRemoteMemory(this->m_Input,(int)pRVar3->WriterRank,pRVar3->Timestep,
                                        pRVar3->StartOffset,pRVar3->ReadLength,
                                        pRVar3->DestinationAddr,DP_TimestepInfo);
      if (iStack_e0._M_current == local_d8) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&local_e8,iStack_e0,(void **)&local_d0);
      }
      else {
        *iStack_e0._M_current = local_d0._M_dataplus._M_p;
        iStack_e0._M_current = iStack_e0._M_current + 1;
      }
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != local_50.
                       super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  iVar1._M_current = iStack_e0._M_current;
  if (local_e8 != iStack_e0._M_current) {
    ppvVar4 = local_e8;
    do {
      SVar2 = SstWaitForCompletion(this->m_Input,*ppvVar4);
      if (SVar2 != SstSuccess) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Engine","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SstReader","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BP5PerformGets","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Writer failed before returning data","");
        helper::Throw<std::runtime_error>(&local_d0,&local_70,&local_90,&local_b0,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      ppvVar4 = ppvVar4 + 1;
    } while (ppvVar4 != iVar1._M_current);
  }
  adios2::format::BP5Deserializer::FinalizeGets(this->m_BP5Deserializer,&local_50);
  adios2::format::BP5Deserializer::ClearGetState(this->m_BP5Deserializer);
  if (local_e8 != (void **)0x0) {
    operator_delete(local_e8);
  }
  if (local_50.
      super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SstReader::BP5PerformGets()
{
    size_t maxReadSize;
    auto ReadRequests = m_BP5Deserializer->GenerateReadRequests(true, &maxReadSize);
    std::vector<void *> sstReadHandlers;
    for (const auto &Req : ReadRequests)
    {
        void *dp_info = NULL;
        if (m_CurrentStepMetaData->DP_TimestepInfo)
        {
            dp_info = m_CurrentStepMetaData->DP_TimestepInfo[Req.WriterRank];
        }
        auto ret = SstReadRemoteMemory(m_Input, (int)Req.WriterRank, Req.Timestep, Req.StartOffset,
                                       Req.ReadLength, Req.DestinationAddr, dp_info);
        sstReadHandlers.push_back(ret);
    }
    for (const auto &i : sstReadHandlers)
    {
        if (SstWaitForCompletion(m_Input, i) != SstSuccess)
        {
            helper::Throw<std::runtime_error>("Engine", "SstReader", "BP5PerformGets",
                                              "Writer failed before returning data");
        }
    }

    m_BP5Deserializer->FinalizeGets(ReadRequests);
    m_BP5Deserializer->ClearGetState();
}